

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O3

void __thiscall duckdb::LogicalInsert::Serialize(LogicalInsert *this,Serializer *serializer)

{
  bool local_21;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_20;
  
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  (*(this->table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[8]
  )(&local_20);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            (serializer,200,"table_info",
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             &local_20);
  if (local_20._M_head_impl != (CreateInfo *)0x0) {
    (*((local_20._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,true>>
            (serializer,0xc9,"insert_values",&this->insert_values);
  (*serializer->_vptr_Serializer[2])(serializer,0xca,"column_index_map");
  Serializer::WriteValue<duckdb::IndexVector<unsigned_long,duckdb::PhysicalIndex>>
            (serializer,&this->column_index_map);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0xcb,"expected_types",&this->expected_types);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xcc,"table_index",&this->table_index);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xcd,"return_chunk",&this->return_chunk);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (serializer,0xce,"bound_defaults",&this->bound_defaults);
  (*serializer->_vptr_Serializer[2])(serializer,0xcf,"action_type");
  Serializer::WriteValue<duckdb::OnConflictAction>(serializer,this->action_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0xd0,"expected_set_types",&this->expected_set_types);
  Serializer::
  WritePropertyWithDefault<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            (serializer,0xd1,"on_conflict_filter",&this->on_conflict_filter);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd2,"on_conflict_condition",&this->on_conflict_condition);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd3,"do_update_condition",&this->do_update_condition);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (serializer,0xd4,"set_columns",&this->set_columns);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0xd5,"set_types",&this->set_types);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xd6,"excluded_table_index",&this->excluded_table_index);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0xd7,"columns_to_fetch",&this->columns_to_fetch);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0xd8,"source_columns",&this->source_columns);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (serializer,0xd9,"expressions",&(this->super_LogicalOperator).expressions);
  local_21 = false;
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xda,"update_is_del_and_insert",&this->update_is_del_and_insert,&local_21);
  return;
}

Assistant:

void LogicalInsert::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WritePropertyWithDefault<unique_ptr<CreateInfo>>(200, "table_info", table.GetInfo());
	serializer.WritePropertyWithDefault<vector<vector<unique_ptr<Expression>>>>(201, "insert_values", insert_values);
	serializer.WriteProperty<IndexVector<idx_t, PhysicalIndex>>(202, "column_index_map", column_index_map);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(203, "expected_types", expected_types);
	serializer.WritePropertyWithDefault<idx_t>(204, "table_index", table_index);
	serializer.WritePropertyWithDefault<bool>(205, "return_chunk", return_chunk);
	serializer.WritePropertyWithDefault<vector<unique_ptr<Expression>>>(206, "bound_defaults", bound_defaults);
	serializer.WriteProperty<OnConflictAction>(207, "action_type", action_type);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(208, "expected_set_types", expected_set_types);
	serializer.WritePropertyWithDefault<unordered_set<idx_t>>(209, "on_conflict_filter", on_conflict_filter);
	serializer.WritePropertyWithDefault<unique_ptr<Expression>>(210, "on_conflict_condition", on_conflict_condition);
	serializer.WritePropertyWithDefault<unique_ptr<Expression>>(211, "do_update_condition", do_update_condition);
	serializer.WritePropertyWithDefault<vector<PhysicalIndex>>(212, "set_columns", set_columns);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(213, "set_types", set_types);
	serializer.WritePropertyWithDefault<idx_t>(214, "excluded_table_index", excluded_table_index);
	serializer.WritePropertyWithDefault<vector<column_t>>(215, "columns_to_fetch", columns_to_fetch);
	serializer.WritePropertyWithDefault<vector<column_t>>(216, "source_columns", source_columns);
	serializer.WritePropertyWithDefault<vector<unique_ptr<Expression>>>(217, "expressions", expressions);
	serializer.WritePropertyWithDefault<bool>(218, "update_is_del_and_insert", update_is_del_and_insert, false);
}